

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gds2writer.cpp
# Opt level: O3

void __thiscall GDS2Writer::~GDS2Writer(GDS2Writer *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_GDS2Writer = (_func_int **)&PTR__GDS2Writer_00142d08;
  writeEpilog(this);
  fclose((FILE *)this->m_fout);
  doLog(1,"GDS2Writer destroyed\n");
  pcVar1 = (this->m_designName)._M_dataplus._M_p;
  paVar2 = &(this->m_designName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

GDS2Writer::~GDS2Writer()
{
    writeEpilog();
    fclose(m_fout);
    doLog(LOG_VERBOSE,"GDS2Writer destroyed\n");
}